

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

btree_result btree_insert(btree *btree,void *key,void *value)

{
  undefined2 uVar1;
  btree_print_func *pbVar2;
  code *pcVar3;
  undefined8 uVar4;
  bid_t bVar5;
  list_elem *plVar6;
  short sVar7;
  void **ppvVar8;
  bnode *pbVar9;
  void *pvVar10;
  bnode **node_00;
  kv_ins_item *pkVar11;
  bid_t *idx_00;
  uint8_t *puVar12;
  idx_t iVar13;
  int iVar14;
  uint8_t *puVar15;
  idx_t *piVar16;
  int8_t *piVar17;
  int8_t *piVar18;
  int8_t *piVar19;
  bnode *pbVar20;
  bnode **ppbVar21;
  long lVar22;
  void *pvVar23;
  undefined8 uVar24;
  list_elem *plVar25;
  bnode *pbStack_180;
  int iStack_174;
  bnode *apbStack_170 [7];
  kv_ins_item kStack_138;
  undefined8 uStack_118;
  bnode *local_110 [3];
  bid_t new_bid;
  list_elem *plStack_f0;
  int _size_check;
  void *new_minkey;
  size_t nodesize;
  int local_d8;
  int _is_update;
  int j;
  int i;
  bnode **node;
  idx_t *idx_ins;
  list_elem *e;
  kv_ins_item *kv_item;
  list *kv_ins_list;
  bnode *pbStack_a0;
  int8_t height_growup;
  int8_t *minkey_replace;
  int8_t *ins;
  int8_t *moved;
  int8_t *modified;
  bid_t _bid;
  bid_t *bid;
  idx_t *idx;
  uint8_t *v;
  uint8_t *k;
  size_t nsplitnode;
  void *addr;
  void *value_local;
  void *key_local;
  btree *btree_local;
  
  key_local = btree;
  value_local = key;
  addr = value;
  k = (uint8_t *)0x1;
  puVar15 = (uint8_t *)((long)&kStack_138 - (ulong)(btree->ksize + 0xf & 0xfffffff0));
  v = puVar15;
  piVar16 = (idx_t *)(puVar15 + -(ulong)(btree->vsize + 0xf & 0xfffffff0));
  idx = piVar16;
  bid = (bid_t *)((long)piVar16 - (ulong)(btree->height + 0xf + (uint)btree->height & 0xfffffff0));
  _bid = (long)bid - (ulong)((uint)btree->height * 8 + 0xf & 0xfffffff0);
  piVar17 = (int8_t *)(_bid - (btree->height + 0xf & 0xfffffff0));
  moved = piVar17;
  piVar18 = piVar17 + -(ulong)(btree->height + 0xf & 0xfffffff0);
  ins = piVar18;
  piVar19 = piVar18 + -(ulong)(btree->height + 0xf & 0xfffffff0);
  minkey_replace = piVar19;
  pbVar20 = (bnode *)(piVar19 + -(ulong)(btree->height + 0xf & 0xfffffff0));
  pbStack_a0 = pbVar20;
  kv_item = (kv_ins_item *)(pbVar20 + -(ulong)btree->height);
  node = (bnode **)
         ((long)(pbVar20 + -(ulong)btree->height) -
         (ulong)(btree->height + 0xf + (uint)btree->height & 0xfffffff0));
  ppbVar21 = (bnode **)((long)node - (ulong)((uint)btree->height * 8 + 0xf & 0xfffffff0));
  _j = ppbVar21;
  nodesize._4_4_ = 0;
  for (_is_update = 0; _is_update < (int)(uint)btree->height; _is_update = _is_update + 1) {
    *(undefined1 *)((long)&pbVar20->kvsize + (long)_is_update) = 0;
    piVar19[_is_update] = '\0';
    piVar17[_is_update] = '\0';
    piVar18[_is_update] = '\0';
  }
  kv_ins_list._7_1_ = '\0';
  if (btree->kv_ops->init_kv_var != (btree_print_func *)0x0) {
    pbVar2 = btree->kv_ops->init_kv_var;
    ppbVar21[-1] = (bnode *)0x129681;
    (*pbVar2)(btree,puVar15,piVar16);
    for (_is_update = 0; _is_update < (int)(uint)*(ushort *)((long)key_local + 2);
        _is_update = _is_update + 1) {
      lVar22 = (long)_is_update;
      ppvVar8 = &kv_item->key;
      ppbVar21[-1] = (bnode *)0x1296b7;
      list_init((list *)(ppvVar8 + lVar22 * 2));
    }
  }
  ppbVar21[-1] = (bnode *)0x1296db;
  e = (list_elem *)_kv_ins_item_create((btree *)ppbVar21[3],ppbVar21[2],ppbVar21[1]);
  pkVar11 = kv_item;
  plVar25 = &((kv_ins_item *)e)->le;
  ppbVar21[-1] = (bnode *)0x1296f9;
  list_push_back((list *)pkVar11,plVar25);
  *minkey_replace = '\x01';
  *(undefined8 *)(_bid + (long)(int)(*(ushort *)((long)key_local + 2) - 1) * 8) =
       *(undefined8 *)((long)key_local + 8);
  _is_update = (int)*(ushort *)((long)key_local + 2);
  while (_is_update = _is_update - 1, -1 < _is_update) {
    pcVar3 = *(code **)(*(long *)((long)key_local + 0x18) + 0x18);
    uVar24 = *(undefined8 *)((long)key_local + 0x10);
    uVar4 = *(undefined8 *)(_bid + (long)_is_update * 8);
    ppbVar21[-1] = (bnode *)0x129764;
    pvVar23 = (void *)(*pcVar3)(uVar24,uVar4);
    pvVar10 = key_local;
    sVar7 = (short)_is_update;
    nsplitnode = (size_t)pvVar23;
    ppbVar21[-1] = (bnode *)0x129781;
    pbVar20 = _fetch_bnode((btree *)pvVar10,pvVar23,sVar7 + 1);
    pvVar23 = key_local;
    pvVar10 = value_local;
    _j[_is_update] = pbVar20;
    pbVar20 = _j[_is_update];
    ppbVar21[-1] = (bnode *)0x1297b5;
    iVar13 = _btree_find_entry((btree *)pvVar23,pbVar20,pvVar10);
    puVar15 = v;
    piVar16 = idx;
    *(idx_t *)((long)bid + (long)_is_update * 2) = iVar13;
    if (0 < _is_update) {
      if (*(short *)((long)bid + (long)_is_update * 2) == -1) {
        *(undefined2 *)((long)bid + (long)_is_update * 2) = 0;
      }
      pcVar3 = (code *)**(undefined8 **)((long)key_local + 0x20);
      pbVar20 = _j[_is_update];
      uVar1 = *(undefined2 *)((long)bid + (long)_is_update * 2);
      ppbVar21[-1] = (bnode *)0x129834;
      (*pcVar3)(pbVar20,uVar1,puVar15,piVar16);
      piVar16 = idx;
      pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x68);
      ppbVar21[-1] = (bnode *)0x129846;
      uVar24 = (*pcVar3)(piVar16);
      *(undefined8 *)(_bid + (long)(_is_update + -1) * 8) = uVar24;
      *(ulong *)(_bid + (long)(_is_update + -1) * 8) =
           *(ulong *)(_bid + (long)(_is_update + -1) * 8) >> 0x38 |
           (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff000000000000) >> 0x28 |
           (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff0000000000) >> 0x18 |
           (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff00000000) >> 8 |
           (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff000000) << 8 |
           (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff0000) << 0x18 |
           (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff00) << 0x28 |
           *(long *)(_bid + (long)(_is_update + -1) * 8) << 0x38;
    }
  }
  for (_is_update = 0; puVar15 = v, _is_update < (int)(uint)*(ushort *)((long)key_local + 2);
      _is_update = _is_update + 1) {
    if (*(short *)((long)bid + (long)_is_update * 2) != -1) {
      pcVar3 = (code *)**(undefined8 **)((long)key_local + 0x20);
      pbVar20 = _j[_is_update];
      uVar1 = *(undefined2 *)((long)bid + (long)_is_update * 2);
      ppbVar21[-1] = (bnode *)0x129a11;
      (*pcVar3)(pbVar20,uVar1,puVar15,0);
    }
    pvVar10 = value_local;
    puVar15 = v;
    if (0 < _is_update) {
      if (*(short *)((long)bid + (long)_is_update * 2) == 0) {
        pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x60);
        uVar24 = *(undefined8 *)((long)key_local + 0x30);
        ppbVar21[-1] = (bnode *)0x129a50;
        iVar14 = (*pcVar3)(pvVar10,puVar15,uVar24);
        if (iVar14 < 0) {
          *(undefined1 *)((long)&pbStack_a0->kvsize + (long)_is_update) = 1;
        }
      }
      if (ins[_is_update + -1] != '\0') {
        modified = (int8_t *)
                   (*(ulong *)(_bid + (long)(_is_update + -1) * 8) >> 0x38 |
                    (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff000000000000) >> 0x28 |
                    (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff0000000000) >> 0x18 |
                    (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff00000000) >> 8 |
                    (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff000000) << 8 |
                    (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff0000) << 0x18 |
                    (*(ulong *)(_bid + (long)(_is_update + -1) * 8) & 0xff00) << 0x28 |
                   *(long *)(_bid + (long)(_is_update + -1) * 8) << 0x38);
        local_110[1] = *(bnode **)(*(long *)((long)key_local + 0x20) + 8);
        kStack_138.le.next = (list_elem *)_j[_is_update];
        uStack_118._6_2_ = *(undefined2 *)((long)bid + (long)_is_update * 2);
        local_110[0] = (bnode *)v;
        pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x70);
        ppbVar21[-1] = (bnode *)0x129c00;
        uVar24 = (*pcVar3)(&modified);
        pbVar9 = local_110[1];
        pbVar20 = local_110[0];
        uVar1 = uStack_118._6_2_;
        plVar25 = kStack_138.le.next;
        ppbVar21[-1] = (bnode *)0x129c24;
        (*(code *)pbVar9)(plVar25,uVar1,pbVar20,uVar24);
        moved[_is_update] = '\x01';
      }
    }
    pkVar11 = kv_item;
    if ((minkey_replace[_is_update] != '\0') ||
       (*(char *)((long)&pbStack_a0->kvsize + (long)_is_update) != '\0')) {
      nodesize._4_4_ = 0;
      if (*(char *)((long)&pbStack_a0->kvsize + (long)_is_update) == '\0') {
        kStack_138.le.prev = (list_elem *)0x0;
      }
      else {
        kStack_138.le.prev = (list_elem *)value_local;
      }
      plStack_f0 = kStack_138.le.prev;
      if (_is_update == 0) {
        ppbVar21[-1] = (bnode *)0x129ccc;
        idx_ins = (idx_t *)list_begin((list *)pkVar11);
        puVar15 = v;
        e = (list_elem *)((long)idx_ins + -0x10);
        kStack_138.value._7_1_ = 0;
        if (*(short *)((long)bid + (long)_is_update * 2) != -1) {
          pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x60);
          plVar25 = ((list_elem *)((long)idx_ins + -0x10))->prev;
          uVar24 = *(undefined8 *)((long)key_local + 0x30);
          ppbVar21[-1] = (bnode *)0x129d28;
          iVar14 = (*pcVar3)(plVar25,puVar15,uVar24);
          kStack_138.value._7_1_ = iVar14 != 0 ^ 0xff;
        }
        nodesize._4_4_ = (uint)(kStack_138.value._7_1_ & 1);
      }
      while( true ) {
        ppbVar21[-1] = (bnode *)0x129d96;
        new_bid._4_4_ =
             _bnode_size_check((btree *)ppbVar21[0xd],(bid_t)ppbVar21[0xc],ppbVar21[0xb],
                               ppbVar21[10],(list *)ppbVar21[9],(size_t *)ppbVar21[8]);
        if ((new_bid._4_4_ != 0) || (nodesize._4_4_ != 0)) break;
        if (*(long *)(*(long *)((long)key_local + 0x18) + 0x10) == 0) {
LAB_00129ff9:
          ppbVar21[-1] = (bnode *)0x12a022;
          k = (uint8_t *)
              _btree_get_nsplitnode
                        ((btree *)ppbVar21[7],(bid_t)ppbVar21[6],ppbVar21[5],(size_t)ppbVar21[4]);
          pvVar23 = key_local;
          pvVar10 = value_local;
          puVar15 = v;
          piVar16 = idx;
          idx_00 = bid;
          bVar5 = _bid;
          piVar18 = moved;
          piVar17 = minkey_replace;
          pbVar20 = pbStack_a0;
          node_00 = _j;
          iVar14 = _is_update;
          if (k == (uint8_t *)0x1) {
            k = (uint8_t *)0x2;
          }
          puVar12 = k;
          ppbVar21[-8] = (bnode *)kv_item;
          ppbVar21[-7] = (bnode *)puVar12;
          ppbVar21[-6] = (bnode *)puVar15;
          ppbVar21[-5] = (bnode *)piVar16;
          ppbVar21[-4] = (bnode *)piVar18;
          ppbVar21[-3] = pbVar20;
          ppbVar21[-2] = (bnode *)piVar17;
          ppbVar21[-9] = (bnode *)0x12a0a3;
          iVar14 = _btree_split_node((btree *)pvVar23,pvVar10,node_00,(bid_t *)bVar5,(idx_t *)idx_00
                                     ,iVar14,(list *)ppbVar21[-8],(size_t)ppbVar21[-7],ppbVar21[-6],
                                     ppbVar21[-5],(int8_t *)ppbVar21[-4],(int8_t *)ppbVar21[-3],
                                     (int8_t *)ppbVar21[-2]);
          kv_ins_list._7_1_ = (char)iVar14;
          goto LAB_0012a0af;
        }
        bVar5 = *(bid_t *)(_bid + (long)_is_update * 8);
        ppbVar21[-1] = (bnode *)0x129f25;
        iVar14 = is_subblock(bVar5);
        pvVar10 = new_minkey;
        if (iVar14 == 0) goto LAB_00129ff9;
        pcVar3 = *(code **)(*(long *)((long)key_local + 0x18) + 0x10);
        uVar24 = *(undefined8 *)((long)key_local + 0x10);
        uVar4 = *(undefined8 *)(_bid + (long)_is_update * 8);
        ppbVar21[-1] = (bnode *)0x129f61;
        pvVar23 = (void *)(*pcVar3)(uVar24,uVar4,pvVar10,local_110 + 2);
        pvVar10 = key_local;
        nsplitnode = (size_t)pvVar23;
        if (pvVar23 == (void *)0x0) goto LAB_00129ff9;
        ins[_is_update] = '\x01';
        *(bnode **)(_bid + (long)_is_update * 8) = local_110[2];
        sVar7 = (short)_is_update;
        ppbVar21[-1] = (bnode *)0x129fb1;
        pbVar20 = _fetch_bnode((btree *)pvVar10,pvVar23,sVar7 + 1);
        _j[_is_update] = pbVar20;
        if (_is_update + 1U == (uint)*(ushort *)((long)key_local + 2)) {
          *(undefined8 *)((long)key_local + 8) = *(undefined8 *)(_bid + (long)_is_update * 8);
        }
      }
      if (minkey_replace[_is_update] != '\0') {
        lVar22 = (long)_is_update;
        ppvVar8 = &kv_item->key;
        ppbVar21[-1] = (bnode *)0x129de4;
        idx_ins = (idx_t *)list_begin((list *)(ppvVar8 + lVar22 * 2));
        while (pvVar10 = key_local, idx_ins != (idx_t *)0x0) {
          e = (list_elem *)(idx_ins + -8);
          pbVar20 = _j[_is_update];
          plVar25 = e->prev;
          pvVar23 = *(void **)(idx_ins + -4);
          ppbVar21[-1] = (bnode *)0x129e37;
          iVar13 = _btree_add_entry((btree *)pvVar10,pbVar20,plVar25,pvVar23);
          piVar16 = idx_ins;
          *(idx_t *)((long)node + (long)_is_update * 2) = iVar13;
          ppbVar21[-1] = (bnode *)0x129e58;
          idx_ins = (idx_t *)list_next((list_elem *)piVar16);
        }
      }
      puVar15 = v;
      piVar16 = idx;
      if (*(char *)((long)&pbStack_a0->kvsize + (long)_is_update) != '\0') {
        pcVar3 = (code *)**(undefined8 **)((long)key_local + 0x20);
        pbVar20 = _j[_is_update];
        uVar1 = *(undefined2 *)((long)bid + (long)_is_update * 2);
        ppbVar21[-1] = (bnode *)0x129eb0;
        (*pcVar3)(pbVar20,uVar1,puVar15,piVar16);
        pvVar10 = value_local;
        piVar16 = idx;
        pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 8);
        pbVar20 = _j[_is_update];
        uVar1 = *(undefined2 *)((long)bid + (long)_is_update * 2);
        ppbVar21[-1] = (bnode *)0x129eea;
        (*pcVar3)(pbVar20,uVar1,pvVar10,piVar16);
      }
      moved[_is_update] = '\x01';
    }
LAB_0012a0af:
    if (kv_ins_list._7_1_ != '\0') break;
    if (moved[_is_update] != '\0') {
      pcVar3 = *(code **)(*(long *)((long)key_local + 0x18) + 0x30);
      uVar24 = *(undefined8 *)((long)key_local + 0x10);
      uVar4 = *(undefined8 *)(_bid + (long)_is_update * 8);
      ppbVar21[-1] = (bnode *)0x12a0f7;
      iVar14 = (*pcVar3)(uVar24,uVar4);
      puVar15 = v;
      piVar16 = idx;
      piVar19 = moved;
      piVar18 = ins;
      piVar17 = minkey_replace;
      pbVar20 = pbStack_a0;
      if (iVar14 == 0) {
        ppbVar21[-8] = (bnode *)kv_item;
        ppbVar21[-7] = (bnode *)puVar15;
        ppbVar21[-6] = (bnode *)piVar16;
        ppbVar21[-5] = (bnode *)piVar19;
        ppbVar21[-4] = pbVar20;
        ppbVar21[-3] = (bnode *)piVar17;
        ppbVar21[-2] = (bnode *)piVar18;
        ppbVar21[-9] = (bnode *)0x12a171;
        iVar14 = _btree_move_modified_node
                           ((btree *)ppbVar21[-3],ppbVar21[-4],(bnode **)ppbVar21[-5],
                            (bid_t *)ppbVar21[-6],&ppbVar21[-7]->kvsize,
                            *(int *)((long)ppbVar21 + -0x3c),(list *)ppbVar21[-1],*ppbVar21,
                            ppbVar21[1],(int8_t *)ppbVar21[2],(int8_t *)ppbVar21[3],
                            (int8_t *)ppbVar21[4],(int8_t *)ppbVar21[5]);
        kv_ins_list._7_1_ = (char)iVar14;
        if ((char)iVar14 != '\0') break;
      }
      else {
        pcVar3 = *(code **)(*(long *)((long)key_local + 0x18) + 0x40);
        uVar24 = *(undefined8 *)((long)key_local + 0x10);
        uVar4 = *(undefined8 *)(_bid + (long)_is_update * 8);
        ppbVar21[-1] = (bnode *)0x12a1ad;
        (*pcVar3)(uVar24,uVar4);
      }
    }
  }
  if (*(long *)(*(long *)((long)key_local + 0x18) + 0x48) != 0) {
    pcVar3 = *(code **)(*(long *)((long)key_local + 0x18) + 0x48);
    uVar24 = *(undefined8 *)((long)key_local + 0x10);
    ppbVar21[-1] = (bnode *)0x12a1ea;
    (*pcVar3)(uVar24);
  }
  pvVar10 = key_local;
  puVar15 = v;
  piVar16 = idx;
  if (*(long *)(*(long *)((long)key_local + 0x20) + 0x38) != 0) {
    pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x38);
    ppbVar21[-1] = (bnode *)0x12a213;
    (*pcVar3)(pvVar10,puVar15,piVar16);
  }
  local_d8 = 0;
  while( true ) {
    kStack_138.value._0_4_ = local_d8;
    if (kv_ins_list._7_1_ == '\0') {
      kStack_138.key._4_4_ = (uint)*(ushort *)((long)key_local + 2);
    }
    else {
      kStack_138.key._4_4_ = *(ushort *)((long)key_local + 2) - 1;
    }
    if ((int)kStack_138.key._4_4_ <= local_d8) break;
    lVar22 = (long)local_d8;
    ppvVar8 = &kv_item->key;
    ppbVar21[-1] = (bnode *)0x12a281;
    idx_ins = (idx_t *)list_begin((list *)(ppvVar8 + lVar22 * 2));
    while (piVar16 = idx_ins, idx_ins != (idx_t *)0x0) {
      e = (list_elem *)(idx_ins + -8);
      lVar22 = (long)local_d8;
      ppvVar8 = &kv_item->key;
      ppbVar21[-1] = (bnode *)0x12a2c9;
      idx_ins = (idx_t *)list_remove((list *)(ppvVar8 + lVar22 * 2),(list_elem *)piVar16);
      pvVar10 = key_local;
      if (*(long *)(*(long *)((long)key_local + 0x20) + 0x38) != 0) {
        pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x38);
        plVar25 = e->prev;
        plVar6 = e->next;
        ppbVar21[-1] = (bnode *)0x12a306;
        (*pcVar3)(pvVar10,plVar25,plVar6);
      }
      ppbVar21[-1] = (bnode *)0x12a312;
      _kv_ins_item_free((kv_ins_item *)ppbVar21[-1]);
    }
    local_d8 = local_d8 + 1;
  }
  btree_local._4_4_ = (btree_result)(nodesize._4_4_ != 0);
  return btree_local._4_4_;
}

Assistant:

btree_result btree_insert(struct btree *btree, void *key, void *value)
{
    void *addr;
    size_t nsplitnode = 1;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v = alca(uint8_t, btree->vsize);
    // index# and block ID for each level
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid = alca(bid_t, btree->height);
    bid_t _bid;
    // flags
    int8_t *modified = alca(int8_t, btree->height);
    int8_t *moved = alca(int8_t, btree->height);
    int8_t *ins = alca(int8_t, btree->height);
    int8_t *minkey_replace = alca(int8_t, btree->height);
    int8_t height_growup;

    // key, value to be inserted
    struct list *kv_ins_list = alca(struct list, btree->height);
    struct kv_ins_item *kv_item;
    struct list_elem *e;

    // index# where kv is inserted
    idx_t *idx_ins = alca(idx_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i, j, _is_update = 0;

    // initialize flags
    for (i=0;i<btree->height;++i) {
        moved[i] = modified[i] = ins[i] = minkey_replace[i] = 0;
    }
    height_growup = 0;

    // initialize temporary variables
    if (btree->kv_ops->init_kv_var) {
        btree->kv_ops->init_kv_var(btree, k, v);
        for (i=0;i<btree->height;++i){
            list_init(&kv_ins_list[i]);
        }
    }

    // copy key-value pair to be inserted into leaf node
    kv_item = _kv_ins_item_create(btree, key, value);
    list_push_back(&kv_ins_list[0], &kv_item->le);

    ins[0] = 1;

    // set root node
    bid[btree->height-1] = btree->root_bid;

    // find path from root to leaf
    for (i=btree->height-1; i>=0; --i){
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (i > 0) {
            // index (non-leaf) node
            if (idx[i] == BTREE_IDX_NOT_FOUND)
                // KEY is smaller than the smallest key in this node ..
                // just follow the smallest key
                idx[i] = 0;

            // get bid of child node from value
            btree->kv_ops->get_kv(node[i], idx[i], k, v);
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node .. do nothing
        }
    }

    // cascaded insert from leaf to root
    for (i=0;i<btree->height;++i){

        if (idx[i] != BTREE_IDX_NOT_FOUND)
            btree->kv_ops->get_kv(node[i], idx[i], k, NULL);

        if (i > 0) {
            // in case of index node
            // when KEY is smaller than smallest key in index node
            if (idx[i] == 0 && btree->kv_ops->cmp(key, k, btree->aux) < 0) {
                // change node's smallest key
                minkey_replace[i] = 1;
            }

            // when child node is moved to new block
            if (moved[i-1]) {
                // replace the bid (value)
                _bid = _endian_encode(bid[i-1]);
                btree->kv_ops->set_kv(node[i], idx[i], k,
                                      btree->kv_ops->bid2value(&_bid));
                modified[i] = 1;
            }
        }

        if (ins[i] || minkey_replace[i]) {
            // there is a key-value pair to be inserted into this (level of)
            // node check whether btree node space is enough to add new
            // key-value pair or not, OR action is not insertion but update
            // (key_ins exists in current node)
            _is_update = 0;
            size_t nodesize;
            void *new_minkey = (minkey_replace[i])?(key):(NULL);

            if (i==0) {
                e = list_begin(&kv_ins_list[i]);
                kv_item = _get_entry(e, struct kv_ins_item, le);
                _is_update =
                    (idx[i] != BTREE_IDX_NOT_FOUND &&
                     !btree->kv_ops->cmp(kv_item->key, k, btree->aux));
            }

        check_node:;
            int _size_check =
                _bnode_size_check(btree, bid[i], node[i], new_minkey,
                                  &kv_ins_list[i], &nodesize);

            if (_size_check || _is_update ) {
                //2 enough space
                if (ins[i]) {
                    // insert key/value pair(s)
                    // insert all kv pairs on list
                    e = list_begin(&kv_ins_list[i]);
                    while(e) {
                        kv_item = _get_entry(e, struct kv_ins_item, le);
                        idx_ins[i] = _btree_add_entry(btree, node[i],
                                                 kv_item->key, kv_item->value);
                        e = list_next(e);
                    }
                }
                if (minkey_replace[i]) {
                    // replace the minimum key in the node to KEY
                    btree->kv_ops->get_kv(node[i], idx[i], k, v);
                    btree->kv_ops->set_kv(node[i], idx[i], key, v);
                }
                modified[i] = 1;

            }else{
                //2 not enough
                // first check if the node can be enlarged
                if (btree->blk_ops->blk_enlarge_node &&
                    is_subblock(bid[i])) {
                    bid_t new_bid;
                    addr = btree->blk_ops->blk_enlarge_node(btree->blk_handle,
                        bid[i], nodesize, &new_bid);
                    if (addr) {
                        // the node can be enlarged .. fetch the enlarged node
                        moved[i] = 1;
                        bid[i] = new_bid;
                        node[i] = _fetch_bnode(btree, addr, i+1);
                        if (i+1 == btree->height) {
                            // if moved node is root node
                            btree->root_bid = bid[i];
                        }
                        // start over
                        goto check_node;
                    }
                }

                //otherwise, split the node
                nsplitnode = _btree_get_nsplitnode(btree, BLK_NOT_FOUND,
                                                   node[i], nodesize);
                // force the node split when the node size of new layout is
                // larger than the current node size
                if (nsplitnode == 1) nsplitnode = 2;

                height_growup = _btree_split_node(
                    btree, key, node, bid, idx, i,
                    kv_ins_list, nsplitnode, k, v,
                    modified, minkey_replace, ins);
            } // split
        } // insert

        if (height_growup) break;

        if (modified[i]) {
            //2 when the node is modified
            if (!btree->blk_ops->blk_is_writable(btree->blk_handle, bid[i])) {
                // not writable .. already flushed block -> cannot overwrite,
                // we have to move to new block
                height_growup = _btree_move_modified_node(
                    btree, key, node, bid, idx, i,
                    kv_ins_list, k, v,
                    modified, minkey_replace, ins, moved);

                if (height_growup) break;
            }else{
                // writable .. just set dirty to write back into storage
                btree->blk_ops->blk_set_dirty(btree->blk_handle, bid[i]);
            } // is writable
        } // is modified
    } // for loop

    // release temporary resources
    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);

    for (j=0; j < ((height_growup)?(btree->height-1):(btree->height)); ++j){
        e = list_begin(&kv_ins_list[j]);
        while(e) {
            kv_item = _get_entry(e, struct kv_ins_item, le);
            e = list_remove(&kv_ins_list[j], e);

            if (btree->kv_ops->free_kv_var) {
                btree->kv_ops->free_kv_var(btree, kv_item->key, kv_item->value);
            }
            _kv_ins_item_free(kv_item);
        }
    }

    if (_is_update) {
        return BTREE_RESULT_UPDATE;
    }else{
        return BTREE_RESULT_SUCCESS;
    }
}